

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::ComputeV2
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *v2)

{
  _List_node_base *p_Var1;
  int isub;
  TPZFNMatrix<100,_float> v2_local;
  TPZFNMatrix<100,_float> Residual_local;
  TPZFNMatrix<100,_float> local_480;
  TPZFNMatrix<100,_float> local_258;
  
  isub = 0;
  p_Var1 = (_List_node_base *)&this->fGlobal;
  while (p_Var1 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->fGlobal) {
    TPZFNMatrix<100,_float>::TPZFNMatrix(&local_258);
    TPZFNMatrix<100,_float>::TPZFNMatrix(&local_480);
    TPZDohrAssembly<float>::Extract
              (((this->fAssemble).fRef)->fPointer,isub,x,&local_258.super_TPZFMatrix<float>);
    TPZDohrSubstructCondense<float>::Contribute_v2_local
              (*(TPZDohrSubstructCondense<float> **)p_Var1[1]._M_next,
               &local_258.super_TPZFMatrix<float>,&local_480.super_TPZFMatrix<float>);
    TPZDohrAssembly<float>::Assemble
              (((this->fAssemble).fRef)->fPointer,isub,&local_480.super_TPZFMatrix<float>,v2);
    TPZFNMatrix<100,_float>::~TPZFNMatrix(&local_480);
    TPZFNMatrix<100,_float>::~TPZFNMatrix(&local_258);
    isub = isub + 1;
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}